

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O3

void __thiscall
QOpenGLTexture::setComparisonFunction(QOpenGLTexture *this,ComparisonFunction function)

{
  QOpenGLTexturePrivate *this_00;
  QOpenGLTextureHelper *pQVar1;
  code *UNRECOVERED_JUMPTABLE;
  long *plVar2;
  
  this_00 = (this->d_ptr).d;
  QOpenGLTexturePrivate::create(this_00);
  if (((this_00->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
       super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x4000) != 0) {
    this_00->comparisonFunction = function;
    pQVar1 = this_00->texFuncs;
    UNRECOVERED_JUMPTABLE = (code *)pQVar1->TextureParameteri;
    plVar2 = (long *)((long)&pQVar1->functions + *(long *)&pQVar1->field_0x10);
    if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
      UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar2 + -1);
    }
    (*UNRECOVERED_JUMPTABLE)
              (plVar2,this_00->textureId,this_00->target,this_00->bindingTarget,0x884d,function);
    return;
  }
  setComparisonFunction();
  return;
}

Assistant:

void QOpenGLTexture::setComparisonFunction(QOpenGLTexture::ComparisonFunction function)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (!d->features.testFlag(TextureComparisonOperators)) {
        qWarning("QOpenGLTexture::setComparisonFunction: requires OpenGL >= 1.5 or OpenGL ES >= 3.0");
        return;
    }
    d->comparisonFunction = function;
    d->texFuncs->glTextureParameteri(d->textureId, d->target, d->bindingTarget, GL_TEXTURE_COMPARE_FUNC, function);
}